

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GlobalStructInference.cpp
# Opt level: O0

Pass * wasm::createGlobalStructInferencePass(void)

{
  GlobalStructInference *this;
  
  this = (GlobalStructInference *)operator_new(0x68);
  memset(this,0,0x68);
  anon_unknown_226::GlobalStructInference::GlobalStructInference(this);
  return &this->super_Pass;
}

Assistant:

Pass* createGlobalStructInferencePass() { return new GlobalStructInference(); }